

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall CLParam<int>::~CLParam(CLParam<int> *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__CLParam_0013eca8;
  std::__cxx11::string::~string((string *)(in_RDI + 6));
  std::__cxx11::string::~string((string *)(in_RDI + 1));
  return;
}

Assistant:

virtual ~CLParam() {}